

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O0

_Bool translateDstIndex(MCInst *mcInst,InternalInstruction *insn)

{
  uint local_1c;
  uint baseRegNo;
  InternalInstruction *insn_local;
  MCInst *mcInst_local;
  
  if (insn->mode == MODE_64BIT) {
    local_1c = 0x27;
    if ((insn->isPrefix67 & 1U) != 0) {
      local_1c = 0x17;
    }
  }
  else if (insn->mode == MODE_32BIT) {
    local_1c = 0x17;
    if ((insn->isPrefix67 & 1U) != 0) {
      local_1c = 0xe;
    }
  }
  else {
    local_1c = 0xe;
    if ((insn->isPrefix67 & 1U) != 0) {
      local_1c = 0x17;
    }
  }
  MCOperand_CreateReg0(mcInst,local_1c);
  return false;
}

Assistant:

static bool translateDstIndex(MCInst *mcInst, InternalInstruction *insn)
{
	unsigned baseRegNo;

	if (insn->mode == MODE_64BIT)
		baseRegNo = insn->isPrefix67 ? X86_EDI : X86_RDI;
	else if (insn->mode == MODE_32BIT)
		baseRegNo = insn->isPrefix67 ? X86_DI : X86_EDI;
	else {
		// assert(insn->mode == MODE_16BIT);
		baseRegNo = insn->isPrefix67 ? X86_EDI : X86_DI;
	}

	MCOperand_CreateReg0(mcInst, baseRegNo);

	return false;
}